

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O2

void __thiscall CDirectiveFile::Encode(CDirectiveFile *this)

{
  int iVar1;
  FileManager *this_00;
  __shared_ptr<AssemblerFile,(__gnu_cxx::_Lock_policy)2> local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  this_00 = g_fileManager;
  iVar1 = *(int *)&(this->super_CAssemblerCommand).field_0x14;
  if (iVar1 - 1U < 3) {
    std::__shared_ptr<AssemblerFile,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<GenericAssemblerFile,void>
              (local_20,&(this->file).
                         super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>);
    FileManager::openFile(this_00,(shared_ptr<AssemblerFile> *)local_20,false);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  }
  else if (iVar1 == 4) {
    FileManager::closeFile(g_fileManager);
    return;
  }
  return;
}

Assistant:

void CDirectiveFile::Encode() const
{
	switch (type)
	{
	case Type::Open:
	case Type::Create:
	case Type::Copy:
		g_fileManager->openFile(file,false);
		break;
	case Type::Close:
		g_fileManager->closeFile();
		break;
	case Type::Invalid:
		// TODO: Assert?
		break;
	}
}